

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509name.c
# Opt level: O0

X509_NAME_ENTRY *
X509_NAME_ENTRY_create_by_txt(X509_NAME_ENTRY **ne,char *field,int type,uchar *bytes,int len)

{
  ASN1_OBJECT *obj_00;
  X509_NAME_ENTRY *nentry;
  ASN1_OBJECT *obj;
  char *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  X509_NAME_ENTRY *local_8;
  
  obj_00 = OBJ_txt2obj(field,0);
  if (obj_00 == (ASN1_OBJECT *)0x0) {
    ERR_new();
    ERR_set_debug((char *)CONCAT44(len,in_stack_ffffffffffffffd0),(int)((ulong)obj_00 >> 0x20),
                  in_stack_ffffffffffffffc0);
    ERR_set_error(0xb,0x77,"name=%s",field);
    local_8 = (X509_NAME_ENTRY *)0x0;
  }
  else {
    local_8 = X509_NAME_ENTRY_create_by_OBJ(ne,obj_00,type,bytes,len);
    ASN1_OBJECT_free(obj_00);
  }
  return local_8;
}

Assistant:

X509_NAME_ENTRY *X509_NAME_ENTRY_create_by_txt(X509_NAME_ENTRY **ne,
                                               const char *field, int type,
                                               const unsigned char *bytes,
                                               int len)
{
    ASN1_OBJECT *obj;
    X509_NAME_ENTRY *nentry;

    obj = OBJ_txt2obj(field, 0);
    if (obj == NULL) {
        ERR_raise_data(ERR_LIB_X509, X509_R_INVALID_FIELD_NAME,
                       "name=%s", field);
        return NULL;
    }
    nentry = X509_NAME_ENTRY_create_by_OBJ(ne, obj, type, bytes, len);
    ASN1_OBJECT_free(obj);
    return nentry;
}